

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_log_module.c
# Opt level: O2

char * ngx_http_log_open_file_cache(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  long *plVar1;
  int iVar2;
  ngx_array_t *pnVar3;
  u_char *puVar4;
  ngx_open_file_cache_t *pnVar5;
  char *pcVar6;
  ngx_http_log_loc_conf_t *llcf;
  ulong uVar7;
  long *plVar8;
  undefined1 local_70 [8];
  ngx_str_t s;
  u_char *local_58;
  u_char *local_48;
  u_char *local_40;
  
  if (*(long *)((long)conf + 8) != -1) {
    return "is duplicate";
  }
  pnVar3 = cf->args;
  local_40 = (u_char *)0x3c;
  local_58 = (u_char *)0xa;
  s.data = (u_char *)0x0;
  local_48 = (u_char *)0x1;
  plVar1 = (long *)pnVar3->elts;
  for (uVar7 = 1; plVar8 = plVar1 + 2, uVar7 < pnVar3->nelts; uVar7 = uVar7 + 1) {
    pcVar6 = (char *)plVar1[3];
    iVar2 = strncmp(pcVar6,"max=",4);
    if (iVar2 == 0) {
      s.data = (u_char *)ngx_atoi((u_char *)(pcVar6 + 4),*plVar8 - 4);
      puVar4 = s.data;
joined_r0x001446e9:
      if (puVar4 == (u_char *)0xffffffffffffffff) {
LAB_001447b0:
        ngx_conf_log_error(1,cf,0,"invalid \"open_log_file_cache\" parameter \"%V\"",plVar8);
        goto LAB_001447c9;
      }
    }
    else {
      iVar2 = strncmp(pcVar6,"inactive=",9);
      if (iVar2 == 0) {
        local_70 = (undefined1  [8])(*plVar8 - 9);
        s.len = (size_t)(pcVar6 + 9);
        local_58 = (u_char *)ngx_parse_time((ngx_str_t *)local_70,1);
        puVar4 = local_58;
        goto joined_r0x001446e9;
      }
      iVar2 = strncmp(pcVar6,"min_uses=",9);
      if (iVar2 == 0) {
        local_48 = (u_char *)ngx_atoi((u_char *)(pcVar6 + 9),*plVar8 - 9);
        puVar4 = local_48;
        goto joined_r0x001446e9;
      }
      iVar2 = strncmp(pcVar6,"valid=",6);
      if (iVar2 == 0) {
        local_70 = (undefined1  [8])(*plVar8 - 6);
        s.len = (size_t)(pcVar6 + 6);
        local_40 = (u_char *)ngx_parse_time((ngx_str_t *)local_70,1);
        puVar4 = local_40;
        goto joined_r0x001446e9;
      }
      iVar2 = strcmp(pcVar6,"off");
      if (iVar2 != 0) goto LAB_001447b0;
      *(undefined8 *)((long)conf + 8) = 0;
    }
    pnVar3 = cf->args;
    plVar1 = plVar8;
  }
  if (*(long *)((long)conf + 8) == 0) {
LAB_001447ac:
    pcVar6 = (char *)0x0;
  }
  else {
    if (s.data == (u_char *)0x0) {
      ngx_conf_log_error(1,cf,0,"\"open_log_file_cache\" must have \"max\" parameter");
    }
    else {
      pnVar5 = ngx_open_file_cache_init(cf->pool,(ngx_uint_t)s.data,(time_t)local_58);
      *(ngx_open_file_cache_t **)((long)conf + 8) = pnVar5;
      if (pnVar5 != (ngx_open_file_cache_t *)0x0) {
        *(u_char **)((long)conf + 0x10) = local_40;
        *(u_char **)((long)conf + 0x18) = local_48;
        goto LAB_001447ac;
      }
    }
LAB_001447c9:
    pcVar6 = (char *)0xffffffffffffffff;
  }
  return pcVar6;
}

Assistant:

static char *
ngx_http_log_open_file_cache(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_log_loc_conf_t *llcf = conf;

    time_t       inactive, valid;
    ngx_str_t   *value, s;
    ngx_int_t    max, min_uses;
    ngx_uint_t   i;

    if (llcf->open_file_cache != NGX_CONF_UNSET_PTR) {
        return "is duplicate";
    }

    value = cf->args->elts;

    max = 0;
    inactive = 10;
    valid = 60;
    min_uses = 1;

    for (i = 1; i < cf->args->nelts; i++) {

        if (ngx_strncmp(value[i].data, "max=", 4) == 0) {

            max = ngx_atoi(value[i].data + 4, value[i].len - 4);
            if (max == NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "inactive=", 9) == 0) {

            s.len = value[i].len - 9;
            s.data = value[i].data + 9;

            inactive = ngx_parse_time(&s, 1);
            if (inactive == (time_t) NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "min_uses=", 9) == 0) {

            min_uses = ngx_atoi(value[i].data + 9, value[i].len - 9);
            if (min_uses == NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "valid=", 6) == 0) {

            s.len = value[i].len - 6;
            s.data = value[i].data + 6;

            valid = ngx_parse_time(&s, 1);
            if (valid == (time_t) NGX_ERROR) {
                goto failed;
            }

            continue;
        }

        if (ngx_strcmp(value[i].data, "off") == 0) {

            llcf->open_file_cache = NULL;

            continue;
        }

    failed:

        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "invalid \"open_log_file_cache\" parameter \"%V\"",
                           &value[i]);
        return NGX_CONF_ERROR;
    }

    if (llcf->open_file_cache == NULL) {
        return NGX_CONF_OK;
    }

    if (max == 0) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                        "\"open_log_file_cache\" must have \"max\" parameter");
        return NGX_CONF_ERROR;
    }

    llcf->open_file_cache = ngx_open_file_cache_init(cf->pool, max, inactive);

    if (llcf->open_file_cache) {

        llcf->open_file_cache_valid = valid;
        llcf->open_file_cache_min_uses = min_uses;

        return NGX_CONF_OK;
    }

    return NGX_CONF_ERROR;
}